

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::MetalMaterial::readFrom(MetalMaterial *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  size_t sVar3;
  undefined8 uVar4;
  runtime_error *this_00;
  
  Material::readFrom(&this->super_Material,binary);
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) <
      binary->currentEntityOffset + 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    this->roughness = *(float *)(puVar2 + binary->currentEntityOffset);
    sVar3 = binary->currentEntityOffset;
    sVar1 = sVar3 + 4;
    binary->currentEntityOffset = sVar1;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      this->uRoughness = *(float *)(puVar2 + sVar1);
      sVar3 = binary->currentEntityOffset;
      sVar1 = sVar3 + 4;
      binary->currentEntityOffset = sVar1;
      puVar2 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(binary->currentEntityData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 8) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"invalid read attempt by entity - not enough data in data block!");
      }
      else {
        this->vRoughness = *(float *)(puVar2 + sVar1);
        sVar3 = binary->currentEntityOffset;
        sVar1 = sVar3 + 4;
        binary->currentEntityOffset = sVar1;
        puVar2 = (binary->currentEntityData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(binary->currentEntityData).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 5) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
        }
        else {
          this->remapRoughness = (bool)puVar2[sVar1];
          binary->currentEntityOffset = binary->currentEntityOffset + 1;
          (*(this->spectrum_eta).super_Entity._vptr_Entity[2])(&this->spectrum_eta,binary);
          (*(this->spectrum_k).super_Entity._vptr_Entity[2])(&this->spectrum_k,binary);
          sVar1 = binary->currentEntityOffset;
          puVar2 = (binary->currentEntityData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(binary->currentEntityData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc)
          {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"invalid read attempt by entity - not enough data in data block!");
          }
          else {
            (this->eta).z = *(float *)(puVar2 + sVar1 + 8);
            uVar4 = *(undefined8 *)(puVar2 + sVar1);
            (this->eta).x = (float)(int)uVar4;
            (this->eta).y = (float)(int)((ulong)uVar4 >> 0x20);
            sVar1 = binary->currentEntityOffset;
            binary->currentEntityOffset = sVar1 + 0xc;
            puVar2 = (binary->currentEntityData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (sVar1 + 0x18 <=
                (ulong)((long)(binary->currentEntityData).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
              (this->k).z = *(float *)(puVar2 + sVar1 + 0x14);
              uVar4 = *(undefined8 *)(puVar2 + sVar1 + 0xc);
              (this->k).x = (float)(int)uVar4;
              (this->k).y = (float)(int)((ulong)uVar4 >> 0x20);
              binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
              BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
              BinaryReader::read<pbrt::Texture>(binary,&this->map_roughness);
              BinaryReader::read<pbrt::Texture>(binary,&this->map_uRoughness);
              BinaryReader::read<pbrt::Texture>(binary,&this->map_vRoughness);
              return;
            }
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"invalid read attempt by entity - not enough data in data block!");
          }
        }
      }
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MetalMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(roughness);
    binary.read(uRoughness);
    binary.read(vRoughness);
    binary.read(remapRoughness);
    binary.read(spectrum_eta);
    binary.read(spectrum_k);
    binary.read(eta);
    binary.read(k);
    binary.read(map_bump);
    binary.read(map_roughness);
    binary.read(map_uRoughness);
    binary.read(map_vRoughness);
  }